

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char head_type;
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  uLong uVar7;
  short *psVar8;
  char *fmt;
  long lVar9;
  int unaff_EBP;
  ulong uVar10;
  long request;
  long request_00;
  bool bVar11;
  long local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar2 = (uint *)a->format->data;
  if (puVar2[0x13ba] == 0xffffffff) {
    puVar2[0x13ba] = 0;
  }
  piVar5 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar5 == (int *)0x0) {
    unaff_EBP = 1;
  }
  else {
    if ((puVar2[0x3c] == 0) &&
       ((((char)*piVar5 == 'M' && (*(char *)((long)piVar5 + 1) == 'Z')) || (*piVar5 == 0x464c457f)))
       ) {
      lVar9 = 0;
      uVar10 = 0x1000;
      do {
        while( true ) {
          if (0x20000 < uVar10 + lVar9) goto LAB_0045abad;
          pvVar6 = __archive_read_ahead(a,uVar10,&local_38);
          if (pvVar6 == (void *)0x0) break;
          if (local_38 < 0x40) goto LAB_0045abad;
          request = 0;
          do {
            if (*(int *)((long)pvVar6 + request + 3) == 0x71a21 &&
                *(int *)((long)pvVar6 + request) == 0x21726152) {
              __archive_read_consume(a,request);
              bVar11 = false;
              unaff_EBP = 0;
              goto LAB_0045abca;
            }
            request_00 = request + 0x10;
            lVar3 = request + 0x17;
            request = request_00;
          } while ((ulong)((long)pvVar6 + lVar3) < (ulong)(local_38 + (long)pvVar6));
          __archive_read_consume(a,request_00);
          lVar9 = lVar9 + request_00;
        }
        bVar11 = 0x7f < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar11);
LAB_0045abad:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
      unaff_EBP = -0x1e;
      bVar11 = true;
LAB_0045abca:
      if (bVar11) {
        return unaff_EBP;
      }
    }
    puVar2[0x3c] = 1;
    do {
      piVar5 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (piVar5 == (int *)0x0) goto LAB_0045ac43;
      head_type = *(char *)((long)piVar5 + 2);
      switch(head_type) {
      case 'r':
        if (*(int *)((long)piVar5 + 3) != 0x71a21 || *piVar5 != 0x21726152) {
          fmt = "Invalid marker header";
          goto LAB_0045ac3c;
        }
        uVar10 = 7;
LAB_0045ae4b:
        __archive_read_consume(a,uVar10);
LAB_0045ae56:
        bVar11 = true;
        break;
      case 's':
        *puVar2 = (uint)*(ushort *)((long)piVar5 + 3);
        uVar1 = *(ushort *)((long)piVar5 + 5);
        uVar10 = (ulong)uVar1;
        if (uVar1 < 0xd) {
LAB_0045ac2d:
          fmt = "Invalid header size";
        }
        else {
          psVar8 = (short *)__archive_read_ahead(a,uVar10,(ssize_t *)0x0);
          if (psVar8 == (short *)0x0) goto LAB_0045ac43;
          *(undefined2 *)(puVar2 + 4) = *(undefined2 *)((long)psVar8 + 7);
          *(undefined4 *)((long)puVar2 + 0x12) = *(undefined4 *)((long)psVar8 + 9);
          if ((*puVar2 >> 9 & 1) != 0) {
            if (uVar1 == 0xd) goto LAB_0045ac2d;
            *(undefined1 *)((long)puVar2 + 0x16) = *(undefined1 *)((long)psVar8 + 0xd);
          }
          if ((char)*puVar2 < '\0') {
            archive_entry_set_is_metadata_encrypted(entry,'\x01');
            archive_entry_set_is_data_encrypted(entry,'\x01');
            puVar2[0x13ba] = 1;
            fmt = "RAR encryption support unavailable.";
            goto LAB_0045ac3c;
          }
          uVar7 = cm_zlib_crc32(0,(uchar *)(psVar8 + 1),uVar1 - 2);
          if (*psVar8 == (short)uVar7) goto LAB_0045ae4b;
LAB_0045adc6:
          fmt = "Header CRC error";
        }
        goto LAB_0045ac3c;
      case 't':
        unaff_EBP = read_header(a,entry,head_type);
        goto LAB_0045acfa;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar1 = *(ushort *)((long)piVar5 + 5);
        uVar10 = (ulong)uVar1;
        if (uVar1 < 7) goto LAB_0045ac2d;
        iVar4 = piVar5[1];
        if (uVar1 != 7) {
          bVar11 = false;
          piVar5 = (int *)__archive_read_ahead(a,uVar10,(ssize_t *)0x0);
          if (piVar5 == (int *)0x0) {
            unaff_EBP = -0x1e;
            break;
          }
        }
        if ((char)iVar4 < '\0') {
          if (uVar1 < 0xb) goto LAB_0045ac2d;
          uVar10 = uVar10 + *(uint *)((long)piVar5 + 7);
          piVar5 = (int *)__archive_read_ahead(a,uVar10,(ssize_t *)0x0);
          if (piVar5 == (int *)0x0) goto LAB_0045ac43;
        }
        uVar7 = cm_zlib_crc32(0,(uchar *)((long)piVar5 + 2),(int)uVar10 - 2);
        if ((short)*piVar5 != (short)uVar7) goto LAB_0045adc6;
        __archive_read_consume(a,uVar10);
        if (head_type != '{') goto LAB_0045ae56;
        unaff_EBP = 1;
LAB_0045acfa:
        bVar11 = false;
        break;
      case 'z':
        iVar4 = read_header(a,entry,head_type);
        if (-0x15 < iVar4) goto LAB_0045ae56;
        bVar11 = false;
        unaff_EBP = iVar4;
        break;
      default:
        fmt = "Bad RAR file";
LAB_0045ac3c:
        archive_set_error(&a->archive,0x54,fmt);
LAB_0045ac43:
        bVar11 = false;
        unaff_EBP = -0x1e;
      }
    } while (bVar11);
  }
  return unaff_EBP;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrytped, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if (skip > 7) {
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        skip += archive_le32dec(p + 7);
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      if (head_type == ENDARC_HEAD)
        return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}